

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressionlistref.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::ExpressionListRef::Copy(ExpressionListRef *this)

{
  _func_int **pp_Var1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar2;
  pointer pPVar3;
  pointer pEVar4;
  type target;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range2;
  _func_int **pp_Var5;
  pointer *__ptr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  TableRef *in_RSI;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  new_val_list;
  __uniq_ptr_impl<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>_>
  local_68;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_60;
  __uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_> local_58;
  TableRef *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_58._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
       (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
       (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)this;
  make_uniq<duckdb::ExpressionListRef>();
  pp_Var1 = *(_func_int ***)&in_RSI[1].type;
  local_50 = in_RSI;
  for (pp_Var5 = in_RSI[1]._vptr_TableRef; pp_Var5 != pp_Var1; pp_Var5 = pp_Var5 + 3) {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::reserve((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&local_48,(long)pp_Var5[1] - (long)*pp_Var5 >> 3);
    puVar2 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)pp_Var5[1];
    for (this_00 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)*pp_Var5; this_00 != puVar2; this_00 = this_00 + 1) {
      pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_00);
      (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_60,pPVar3);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_48,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_60);
      if (local_60._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    pEVar4 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
             ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                           *)&local_68);
    ::std::
    vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>>
    ::
    emplace_back<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>>
                *)&pEVar4->values,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_48);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&local_48);
  }
  pEVar4 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                         *)&local_68);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pEVar4->expected_names,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_50[1].sample);
  pEVar4 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                         *)&local_68);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pEVar4->expected_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &local_50[1].alias._M_string_length);
  target = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
           ::operator*((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                        *)&local_68);
  TableRef::CopyProperties(local_50,&target->super_TableRef);
  *(tuple<duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_> *)
   local_58._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
   super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
       local_68._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
       .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
         local_58._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<TableRef> ExpressionListRef::Copy() {
	// value list
	auto result = make_uniq<ExpressionListRef>();
	for (auto &val_list : values) {
		vector<unique_ptr<ParsedExpression>> new_val_list;
		new_val_list.reserve(val_list.size());
		for (auto &val : val_list) {
			new_val_list.push_back(val->Copy());
		}
		result->values.push_back(std::move(new_val_list));
	}
	result->expected_names = expected_names;
	result->expected_types = expected_types;
	CopyProperties(*result);
	return std::move(result);
}